

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O1

void __thiscall TC_parser<false>::maybeFeature(TC_parser<false> *this)

{
  byte bVar1;
  size_t sVar2;
  example *peVar3;
  features *pfVar4;
  float *_begin;
  unsigned_long *_begin_00;
  bool bVar5;
  substring s;
  substring sVar6;
  uint uVar7;
  uint64_t uVar8;
  feature_index i;
  uint64_t uVar9;
  pointer ppvVar10;
  features **ppfVar11;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  long lVar15;
  uint uVar16;
  byte *pbVar17;
  ulong uVar18;
  float fVar19;
  substring sVar20;
  char d;
  substring feature_name;
  char local_49;
  substring local_48;
  float local_34;
  
  local_48.begin = this->reading_head;
  bVar1 = *local_48.begin;
  if ((((bVar1 != 9) && (bVar1 != 0x20)) && (bVar1 != 0x7c)) &&
     (local_48.end = local_48.begin, bVar1 != 0xd && local_48.begin != this->endLine)) {
    while( true ) {
      bVar1 = *local_48.end;
      if ((((ulong)bVar1 < 0x3b) && ((0x400000100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
         ((bVar1 == 0x7c || ((local_48.end == this->endLine || (bVar1 == 0xd)))))) break;
      this->reading_head = (char *)((byte *)local_48.end + 1);
      local_48.end = (char *)((byte *)local_48.end + 1);
    }
    local_34 = this->cur_channel_v;
    fVar19 = featureValue(this);
    this->v = fVar19 * local_34;
    sVar6.end = local_48.end;
    sVar6.begin = local_48.begin;
    if (local_48.end == local_48.begin) {
      sVar2 = this->anon;
      this->anon = sVar2 + 1;
      i = sVar2 + this->channel_hash;
    }
    else {
      uVar8 = (*this->p->hasher)(sVar6,this->channel_hash);
      i = uVar8 & this->parse_mask;
    }
    fVar19 = this->v;
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      features::push_back((this->ae->super_example_predict).feature_space + this->index,fVar19,i);
      if ((this->affix_features[this->index] != 0) && (local_48.end != local_48.begin)) {
        peVar3 = this->ae;
        if ((peVar3->super_example_predict).feature_space[0x84].values._end ==
            (peVar3->super_example_predict).feature_space[0x84].values._begin) {
          v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar3,&affix_namespace);
        }
        if (this->affix_features[this->index] != 0) {
          uVar8 = this->affix_features[this->index];
          do {
            uVar18 = (ulong)((uint)(uVar8 >> 1) & 7);
            pbVar17 = (byte *)local_48.end;
            pbVar14 = (byte *)local_48.begin;
            if ((local_48.begin + uVar18 < local_48.end) &&
               (pbVar17 = (byte *)(local_48.begin + uVar18), (uVar8 & 1) == 0)) {
              pbVar14 = (byte *)(local_48.end + -uVar18);
              pbVar17 = (byte *)local_48.end;
            }
            sVar20.end = (char *)pbVar17;
            sVar20.begin = (char *)pbVar14;
            uVar9 = (*this->p->hasher)(sVar20,this->channel_hash);
            features::push_back((peVar3->super_example_predict).feature_space + 0x84,this->v,
                                ((ulong)((uint)uVar8 & 0xf) * 0x1aa5cfd + 0xd42855) * uVar9);
            bVar5 = 0xf < uVar8;
            uVar8 = uVar8 >> 4;
          } while (bVar5);
        }
      }
      if (this->spelling_features[this->index] == true) {
        peVar3 = this->ae;
        if ((peVar3->super_example_predict).feature_space[0x85].values._end ==
            (peVar3->super_example_predict).feature_space[0x85].values._begin) {
          v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar3,&spelling_namespace);
        }
        v_array<char>::clear(&this->spelling);
        if (local_48.begin != local_48.end) {
          pbVar17 = (byte *)local_48.begin;
          do {
            bVar1 = *pbVar17;
            if ((byte)(bVar1 - 0x30) < 10) {
              local_49 = '0';
            }
            else if ((byte)(bVar1 + 0x9f) < 0x1a) {
              local_49 = 'a';
            }
            else if ((byte)(bVar1 + 0xbf) < 0x1a) {
              local_49 = 'A';
            }
            else if (bVar1 == 0x2e) {
              local_49 = '.';
            }
            else {
              local_49 = '#';
            }
            v_array<char>::push_back(&this->spelling,&local_49);
            pbVar17 = pbVar17 + 1;
          } while (pbVar17 != (byte *)local_48.end);
        }
        s.begin = (this->spelling)._begin;
        s.end = (this->spelling)._end;
        uVar8 = hashstring(s,this->channel_hash);
        features::push_back((peVar3->super_example_predict).feature_space + 0x85,this->v,uVar8);
      }
      if ((this->namespace_dictionaries[this->index].
           super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           this->namespace_dictionaries[this->index].
           super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
           ._M_impl.super__Vector_impl_data._M_start) &&
         (ppvVar10 = this->namespace_dictionaries[this->index].
                     super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
         this->namespace_dictionaries[this->index].
         super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish != ppvVar10)) {
        uVar18 = 0;
        do {
          uVar7 = (int)local_48.end - (int)local_48.begin;
          uVar12 = uVar7;
          if ((int)uVar7 < 0) {
            uVar12 = uVar7 + 3;
          }
          pbVar17 = (byte *)(local_48.begin + (int)(uVar12 & 0xfffffffc));
          uVar16 = 0x1aa5cfd;
          if (6 < uVar7 + 3) {
            lVar15 = (long)-((int)uVar12 >> 2);
            do {
              uVar16 = ((uint)(*(int *)(pbVar17 + lVar15 * 4) * -0x3361d2af) >> 0x11 |
                       *(int *)(pbVar17 + lVar15 * 4) * 0x16a88000) * 0x1b873593 ^ uVar16;
              uVar16 = (uVar16 << 0xd | uVar16 >> 0x13) * 5 + 0xe6546b64;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0);
          }
          uVar13 = 0;
          uVar12 = 0;
          switch(uVar7 & 3) {
          case 3:
            uVar12 = (uint)pbVar17[2] << 0x10;
          case 2:
            uVar13 = uVar12 | (uint)pbVar17[1] << 8;
          case 1:
            uVar16 = uVar16 ^ ((*pbVar17 ^ uVar13) * -0x3361d2af >> 0x11 |
                              (*pbVar17 ^ uVar13) * 0x16a88000) * 0x1b873593;
          }
          uVar7 = ((uVar16 ^ uVar7) >> 0x10 ^ uVar16 ^ uVar7) * -0x7a143595;
          uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
          ppfVar11 = v_hashmap<substring,_features_*>::get
                               (ppvVar10[uVar18],&local_48,(ulong)(uVar7 >> 0x10 ^ uVar7));
          pfVar4 = *ppfVar11;
          if ((pfVar4 != (features *)0x0) && ((pfVar4->values)._end != (pfVar4->values)._begin)) {
            peVar3 = this->ae;
            if ((peVar3->super_example_predict).feature_space[0x87].values._end ==
                (peVar3->super_example_predict).feature_space[0x87].values._begin) {
              v_array<unsigned_char>::push_back
                        ((v_array<unsigned_char> *)peVar3,&dictionary_namespace);
            }
            _begin = (pfVar4->values)._begin;
            push_many<float>(&(peVar3->super_example_predict).feature_space[0x87].values,_begin,
                             (long)(pfVar4->values)._end - (long)_begin >> 2);
            _begin_00 = (pfVar4->indicies)._begin;
            push_many<unsigned_long>
                      (&(peVar3->super_example_predict).feature_space[0x87].indicies,_begin_00,
                       (long)(pfVar4->indicies)._end - (long)_begin_00 >> 3);
            (peVar3->super_example_predict).feature_space[0x87].sum_feat_sq =
                 pfVar4->sum_feat_sq +
                 (peVar3->super_example_predict).feature_space[0x87].sum_feat_sq;
          }
          uVar18 = uVar18 + 1;
          ppvVar10 = this->namespace_dictionaries[this->index].
                     super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar18 < (ulong)((long)this->namespace_dictionaries[this->index].
                                        super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10
                                 >> 3));
      }
    }
  }
  return;
}

Assistant:

inline void maybeFeature()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
    {
      // maybeFeature --> ø
    }
    else
    {
      // maybeFeature --> 'String' FeatureValue
      substring feature_name = read_name();
      v = cur_channel_v * featureValue();
      uint64_t word_hash;
      if (feature_name.end != feature_name.begin)
        word_hash = (p->hasher(feature_name, channel_hash) & parse_mask);
      else
        word_hash = channel_hash + anon++;
      if (v == 0)
        return;  // dont add 0 valued features to list of features
      features& fs = ae->feature_space[index];
      fs.push_back(v, word_hash);
      if (audit)
      {
        v_array<char> feature_v = v_init<char>();
        push_many(feature_v, feature_name.begin, feature_name.end - feature_name.begin);
        feature_v.push_back('\0');
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(base, feature_v.begin())));
        feature_v.delete_v();
      }
      if ((affix_features[index] > 0) && (feature_name.end != feature_name.begin))
      {
        features& affix_fs = ae->feature_space[affix_namespace];
        if (affix_fs.size() == 0)
          ae->indices.push_back(affix_namespace);
        uint64_t affix = affix_features[index];
        while (affix > 0)
        {
          bool is_prefix = affix & 0x1;
          uint64_t len = (affix >> 1) & 0x7;
          substring affix_name = {feature_name.begin, feature_name.end};
          if (affix_name.end > affix_name.begin + len)
          {
            if (is_prefix)
              affix_name.end = affix_name.begin + len;
            else
              affix_name.begin = affix_name.end - len;
          }
          word_hash =
              p->hasher(affix_name, (uint64_t)channel_hash) * (affix_constant + (affix & 0xF) * quadratic_constant);
          affix_fs.push_back(v, word_hash);
          if (audit)
          {
            v_array<char> affix_v = v_init<char>();
            if (index != ' ')
              affix_v.push_back(index);
            affix_v.push_back(is_prefix ? '+' : '-');
            affix_v.push_back('0' + (char)len);
            affix_v.push_back('=');
            push_many(affix_v, affix_name.begin, affix_name.end - affix_name.begin);
            affix_v.push_back('\0');
            affix_fs.space_names.push_back(audit_strings_ptr(new audit_strings("affix", affix_v.begin())));
          }
          affix >>= 4;
        }
      }
      if (spelling_features[index])
      {
        features& spell_fs = ae->feature_space[spelling_namespace];
        if (spell_fs.size() == 0)
          ae->indices.push_back(spelling_namespace);
        // v_array<char> spelling;
        spelling.clear();
        for (char* c = feature_name.begin; c != feature_name.end; ++c)
        {
          char d = 0;
          if ((*c >= '0') && (*c <= '9'))
            d = '0';
          else if ((*c >= 'a') && (*c <= 'z'))
            d = 'a';
          else if ((*c >= 'A') && (*c <= 'Z'))
            d = 'A';
          else if (*c == '.')
            d = '.';
          else
            d = '#';
          // if ((spelling.size() == 0) || (spelling.last() != d))
          spelling.push_back(d);
        }
        substring spelling_ss = {spelling.begin(), spelling.end()};
        uint64_t word_hash = hashstring(spelling_ss, (uint64_t)channel_hash);
        spell_fs.push_back(v, word_hash);
        if (audit)
        {
          v_array<char> spelling_v = v_init<char>();
          if (index != ' ')
          {
            spelling_v.push_back(index);
            spelling_v.push_back('_');
          }
          push_many(spelling_v, spelling_ss.begin, spelling_ss.end - spelling_ss.begin);
          spelling_v.push_back('\0');
          spell_fs.space_names.push_back(audit_strings_ptr(new audit_strings("spelling", spelling_v.begin())));
        }
      }
      if (namespace_dictionaries[index].size() > 0)
      {
        for (size_t dict = 0; dict < namespace_dictionaries[index].size(); dict++)
        {
          feature_dict* map = namespace_dictionaries[index][dict];
          uint64_t hash = uniform_hash(feature_name.begin, feature_name.end - feature_name.begin, quadratic_constant);
          features* feats = map->get(feature_name, hash);
          if ((feats != nullptr) && (feats->values.size() > 0))
          {
            features& dict_fs = ae->feature_space[dictionary_namespace];
            if (dict_fs.size() == 0)
              ae->indices.push_back(dictionary_namespace);
            push_many(dict_fs.values, feats->values.begin(), feats->values.size());
            push_many(dict_fs.indicies, feats->indicies.begin(), feats->indicies.size());
            dict_fs.sum_feat_sq += feats->sum_feat_sq;
            if (audit)
              for (size_t i = 0; i < feats->indicies.size(); ++i)
              {
                uint64_t id = feats->indicies[i];
                stringstream ss;
                ss << index << '_';
                for (char* fc = feature_name.begin; fc != feature_name.end; ++fc) ss << *fc;
                ss << '=' << id;
                dict_fs.space_names.push_back(audit_strings_ptr(new audit_strings("dictionary", ss.str())));
              }
          }
        }
      }
    }
  }